

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O1

vector<FileStatus,_std::allocator<FileStatus>_> * workStatus(void)

{
  vector<FileStatus,_std::allocator<FileStatus>_> *in_RDI;
  string new_dir;
  string local_80;
  string local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,STAGE_DIR_abi_cxx11_._M_dataplus._M_p,
             STAGE_DIR_abi_cxx11_._M_dataplus._M_p + STAGE_DIR_abi_cxx11_._M_string_length);
  diffStatus(in_RDI,&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return in_RDI;
}

Assistant:

Vector<FileStatus> workStatus(){
    String new_dir = ".";
    Vector<FileStatus> result = diffStatus(new_dir,STAGE_DIR);
    return result;
}